

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifUtil.c
# Opt level: O2

void If_ManMarkMapping(If_Man_t *p)

{
  void *pvVar1;
  int i;
  int iVar2;
  float fVar3;
  
  for (iVar2 = 0; iVar2 < p->vObjs->nSize; iVar2 = iVar2 + 1) {
    pvVar1 = Vec_PtrEntry(p->vObjs,iVar2);
    *(undefined4 *)((long)pvVar1 + 0x34) = 0x60ad78ec;
    *(undefined4 *)((long)pvVar1 + 0x10) = *(undefined4 *)((long)pvVar1 + 0x14);
    *(undefined4 *)((long)pvVar1 + 0xc) = 0;
  }
  p->dPower = 0.0;
  p->AreaGlo = 0.0;
  p->nNets = 0;
  for (iVar2 = 0; iVar2 < p->vCos->nSize; iVar2 = iVar2 + 1) {
    pvVar1 = Vec_PtrEntry(p->vCos,iVar2);
    fVar3 = If_ManMarkMapping_rec(p,*(If_Obj_t **)((long)pvVar1 + 0x18));
    p->AreaGlo = fVar3 + p->AreaGlo;
  }
  return;
}

Assistant:

void If_ManMarkMapping( If_Man_t * p )
{
    If_Obj_t * pObj;
    int i;
    If_ManForEachObj( p, pObj, i )
    {
        pObj->Required = IF_FLOAT_LARGE;
        pObj->nVisits = pObj->nVisitsCopy;
        pObj->nRefs = 0;
    }
    p->nNets = 0;
    p->dPower = 0.0;
    p->AreaGlo = 0.0;
    If_ManForEachCo( p, pObj, i )
        p->AreaGlo += If_ManMarkMapping_rec( p, If_ObjFanin0(pObj) );
}